

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

void delete_program_code(rar_program_code *prog)

{
  rar_program_code *prVar1;
  
  if (prog != (rar_program_code *)0x0) {
    do {
      prVar1 = prog->next;
      free(prog->staticdata);
      free(prog->globalbackup);
      free(prog);
      prog = prVar1;
    } while (prVar1 != (rar_program_code *)0x0);
  }
  return;
}

Assistant:

static void
delete_program_code(struct rar_program_code *prog)
{
  while (prog)
  {
    struct rar_program_code *next = prog->next;
    free(prog->staticdata);
    free(prog->globalbackup);
    free(prog);
    prog = next;
  }
}